

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void UpdateWindowInFocusOrderList(ImGuiWindow *window,bool just_created,ImGuiWindowFlags new_flags)

{
  int *piVar1;
  ImGuiWindow **ppIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiWindow **ppIVar5;
  short sVar6;
  int iVar7;
  long lVar8;
  uint uVar10;
  bool bVar11;
  int iVar12;
  ImGuiContext *ctx;
  ulong uVar9;
  
  pIVar3 = GImGui;
  uVar10 = new_flags & 0x1000000;
  bVar11 = SUB41(uVar10 >> 0x18,0);
  if ((~just_created & uVar10 >> 0x18 == (uint)window->IsExplicitChild) == 0 && bVar11 == false) {
    iVar4 = (GImGui->WindowsFocusOrder).Size;
    if (iVar4 == (GImGui->WindowsFocusOrder).Capacity) {
      if (iVar4 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar4 / 2 + iVar4;
      }
      iVar12 = iVar4 + 1;
      if (iVar4 + 1 < iVar7) {
        iVar12 = iVar7;
      }
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      ppIVar5 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar12 << 3,GImAllocatorUserData);
      ppIVar2 = (pIVar3->WindowsFocusOrder).Data;
      if (ppIVar2 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar5,ppIVar2,(long)(pIVar3->WindowsFocusOrder).Size << 3);
        ppIVar2 = (pIVar3->WindowsFocusOrder).Data;
        if ((ppIVar2 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
      }
      (pIVar3->WindowsFocusOrder).Data = ppIVar5;
      (pIVar3->WindowsFocusOrder).Capacity = iVar12;
      iVar4 = (pIVar3->WindowsFocusOrder).Size;
    }
    else {
      ppIVar5 = (GImGui->WindowsFocusOrder).Data;
    }
    ppIVar5[iVar4] = window;
    iVar4 = (pIVar3->WindowsFocusOrder).Size;
    (pIVar3->WindowsFocusOrder).Size = iVar4 + 1;
    window->FocusOrder = (short)iVar4;
  }
  else if ((uVar10 != 0 && !just_created) && uVar10 >> 0x18 != (uint)window->IsExplicitChild) {
    sVar6 = window->FocusOrder;
    iVar4 = (GImGui->WindowsFocusOrder).Size;
    ppIVar5 = (GImGui->WindowsFocusOrder).Data;
    if (sVar6 + 1 < iVar4) {
      lVar8 = (long)(int)sVar6 + 1;
      do {
        ppIVar5[lVar8]->FocusOrder = ppIVar5[lVar8]->FocusOrder + -1;
        lVar8 = lVar8 + 1;
      } while (iVar4 != lVar8);
      sVar6 = window->FocusOrder;
    }
    uVar9 = (ulong)sVar6;
    memmove(ppIVar5 + uVar9,ppIVar5 + uVar9 + 1,((long)iVar4 + ~uVar9) * 8);
    (pIVar3->WindowsFocusOrder).Size = (pIVar3->WindowsFocusOrder).Size + -1;
    window->FocusOrder = -1;
  }
  window->IsExplicitChild = bVar11;
  return;
}

Assistant:

static void UpdateWindowInFocusOrderList(ImGuiWindow* window, bool just_created, ImGuiWindowFlags new_flags)
{
    ImGuiContext& g = *GImGui;

    const bool new_is_explicit_child = (new_flags & ImGuiWindowFlags_ChildWindow) != 0;
    const bool child_flag_changed = new_is_explicit_child != window->IsExplicitChild;
    if ((just_created || child_flag_changed) && !new_is_explicit_child)
    {
        IM_ASSERT(!g.WindowsFocusOrder.contains(window));
        g.WindowsFocusOrder.push_back(window);
        window->FocusOrder = (short)(g.WindowsFocusOrder.Size - 1);
    }
    else if (!just_created && child_flag_changed && new_is_explicit_child)
    {
        IM_ASSERT(g.WindowsFocusOrder[window->FocusOrder] == window);
        for (int n = window->FocusOrder + 1; n < g.WindowsFocusOrder.Size; n++)
            g.WindowsFocusOrder[n]->FocusOrder--;
        g.WindowsFocusOrder.erase(g.WindowsFocusOrder.Data + window->FocusOrder);
        window->FocusOrder = -1;
    }
    window->IsExplicitChild = new_is_explicit_child;
}